

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O1

void dump_array16(int *array,int size)

{
  ulong uVar1;
  
  uVar1 = 1;
  do {
    printf("0x%04x, ",(ulong)(uint)array[uVar1 - 1]);
    if ((uVar1 & 7) == 0) {
      printf("\n  ");
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x80);
  printf("0x%04x\n};\n\n",(ulong)(uint)array[0x7f]);
  return;
}

Assistant:

static void dump_array16(int array[],int size){
	int i;
	--size;
	for (i = 0; i < size; ++i) {
		printf("0x%04x, ", array[i]);
		if(!((i+1)&0x7))
			printf("\n  ");
	}
	printf("0x%04x\n};\n\n", array[size]);
}